

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O0

Ssw_Man_t * Ssw_ManCreate(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Ssw_Man_t *__s;
  Aig_Obj_t **ppAVar4;
  Vec_Ptr_t *pVVar5;
  uint *puVar6;
  Vec_Int_t *pVVar7;
  Ssw_Man_t *p;
  Ssw_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Saig_ManRegNum(pAig);
  if (0 < iVar1) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    __s = (Ssw_Man_t *)malloc(0x1a8);
    memset(__s,0,0x1a8);
    __s->pPars = pPars;
    __s->pAig = pAig;
    __s->nFrames = pPars->nFramesK + 1;
    iVar1 = Aig_ManObjNumMax(__s->pAig);
    ppAVar4 = (Aig_Obj_t **)calloc((long)(iVar1 * __s->nFrames),8);
    __s->pNodeToFrames = ppAVar4;
    pVVar5 = Vec_PtrAlloc(100);
    __s->vCommon = pVVar5;
    __s->iOutputLit = -1;
    iVar2 = Saig_ManPiNum(pAig);
    iVar1 = __s->nFrames;
    iVar3 = Saig_ManRegNum(pAig);
    iVar1 = Abc_BitWordNum(iVar2 * iVar1 + iVar3);
    __s->nPatWords = iVar1;
    puVar6 = (uint *)calloc((long)__s->nPatWords,4);
    __s->pPatWords = puVar6;
    pVVar5 = Vec_PtrAlloc(100);
    __s->vNewLos = pVVar5;
    pVVar7 = Vec_IntAlloc(100);
    __s->vNewPos = pVVar7;
    pVVar5 = Vec_PtrAlloc(100);
    __s->vResimConsts = pVVar5;
    pVVar5 = Vec_PtrAlloc(100);
    __s->vResimClasses = pVVar5;
    return __s;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswMan.c"
                ,0x31,"Ssw_Man_t *Ssw_ManCreate(Aig_Man_t *, Ssw_Pars_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Man_t * Ssw_ManCreate( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Ssw_Man_t, 1 );
    memset( p, 0, sizeof(Ssw_Man_t) );
    p->pPars         = pPars;
    p->pAig          = pAig;
    p->nFrames       = pPars->nFramesK + 1;
    p->pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * p->nFrames );
    p->vCommon       = Vec_PtrAlloc( 100 );
    p->iOutputLit    = -1;
    // allocate storage for sim pattern
    p->nPatWords     = Abc_BitWordNum( Saig_ManPiNum(pAig) * p->nFrames + Saig_ManRegNum(pAig) );
    p->pPatWords     = ABC_CALLOC( unsigned, p->nPatWords );
    // other
    p->vNewLos       = Vec_PtrAlloc( 100 );
    p->vNewPos       = Vec_IntAlloc( 100 );
    p->vResimConsts  = Vec_PtrAlloc( 100 );
    p->vResimClasses = Vec_PtrAlloc( 100 );
//    p->pPars->fVerbose = 1;
    return p;
}